

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::HttpServer::Connection::LoopResult> * __thiscall
kj::_::ExceptionOr<kj::HttpServer::Connection::LoopResult>::operator=
          (ExceptionOr<kj::HttpServer::Connection::LoopResult> *this,
          ExceptionOr<kj::HttpServer::Connection::LoopResult> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::HttpServer::Connection::LoopResult>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;